

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extMul<2ul,unsigned_int,unsigned_long,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Type *other;
  uint uVar1;
  uint uVar2;
  Literal *val;
  long lVar3;
  Literal *this_00;
  Literal *this_01;
  bool bVar4;
  undefined1 local_148 [8];
  LaneArray<2UL_*_2> lhs;
  LaneArray<2UL_*_2> rhs;
  LaneArray<2UL> result;
  Literal *local_38;
  
  getLanes<unsigned_int,4>((LaneArray<4> *)local_148,this,a);
  getLanes<unsigned_int,4>((LaneArray<4> *)&lhs._M_elems[3].type,(wasm *)a,val);
  this_01 = (Literal *)&rhs._M_elems[3].type;
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  rhs._M_elems[3].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  local_38 = (Literal *)&rhs._M_elems[1].type;
  lVar3 = 2;
  this_00 = (Literal *)&lhs._M_elems[1].type;
  other = &result._M_elems[1].type;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    uVar1 = Literal::geti32(this_00);
    uVar2 = Literal::geti32(local_38);
    result._M_elems[1].type.id = (ulong)uVar2 * (ulong)uVar1;
    if (this_01 != (Literal *)other) {
      Literal::~Literal(this_01);
      Literal::Literal(this_01,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
    this_01 = this_01 + 1;
    local_38 = local_38 + 1;
    this_00 = this_00 + 1;
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)&rhs._M_elems[3].type);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&rhs._M_elems[3].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&lhs._M_elems[3].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}